

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O2

void Unit_cmp(void)

{
  unit *up;
  unit *puVar1;
  FILE *__stream;
  long lVar2;
  
  puVar1 = usp;
  if (UnitsOn != '\x01') {
    return;
  }
  if (unit_stack < usp) {
    if (usp->isnum == 0) {
      if (usp[-1].isnum != 0) {
        for (lVar2 = -0x10; lVar2 != -6; lVar2 = lVar2 + 1) {
          puVar1->dim[lVar2 + -8] = puVar1[1].dim[lVar2 + -8];
        }
        puVar1[-1].factor = puVar1->factor;
        puVar1[-1].isnum = 0;
      }
      __stream = _stderr;
      if (((unitonflag != 0) && (puVar1[-1].dim[0] != '\t')) && (puVar1->dim[0] != '\t')) {
        up = puVar1 + -1;
        for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
          if (puVar1->dim[lVar2 + -0x18] != usp->dim[lVar2]) {
            if (fperrc != 0) {
              diag("underflow or overflow in units calculation",(char *)0x0);
            }
            fwrite("\nunits:",7,1,_stderr);
            units(usp);
            fwrite("\nunits:",7,1,_stderr);
            units(up);
            diag("The units of the previous two expressions are not conformable","\n");
          }
        }
        if (1e-05 < ABS(usp->factor / up->factor + -1.0)) {
          if (fperrc != 0) {
            diag("underflow or overflow in units calculation",(char *)0x0);
          }
          Unit_str(usp);
          fprintf(__stream,
                  "The previous primary expression with units: %s\nis missing a conversion factor and should read:\n  (%g)*("
                  ,usp->factor / up->factor,Unit_str::buf);
          diag(")\n",(char *)0x0);
        }
      }
    }
    unit_pop();
    return;
  }
  __assert_fail("usp > unit_stack",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/units.c"
                ,0x177,"void Unit_cmp()");
}

Assistant:

void Unit_cmp() {
	/*compares top two units on stack. If not conformable then
	gives error. If not same factor then gives error.
	*/
	struct unit *up;
	int i;
	
	IFUNITS
	assert(usp > unit_stack);
	up = usp - 1;
	if (usp->isnum) {
		unit_pop();
		return;
	}
	if (up->isnum) {
		for (i=0; i < NDIM; i++) {
			up->dim[i] = usp->dim[i];
		}
		up->factor = usp->factor;
		up->isnum = 0;
	}
if (unitonflag && up->dim[0] != 9 && usp->dim[0] != 9) {
	for (i=0; i<NDIM; i++) {
		if (up->dim[i] != usp->dim[i]) {
			chkfperror();
			print_unit_expr(2);
			fprintf(stderr, "\nunits:");
			units(usp);
			print_unit_expr(1);
			fprintf(stderr, "\nunits:");
			units(up);
diag("The units of the previous two expressions are not conformable","\n");
		}
	}
	if (OUTTOLERANCE(up->factor, usp->factor)) {
		chkfperror();
fprintf(stderr, "The previous primary expression with units: %s\n\
is missing a conversion factor and should read:\n  (%g)*(",
Unit_str(usp), usp->factor/up->factor);
		print_unit_expr(2);
		diag(")\n", (char *)0);
	}
}
	unit_pop();
	return;
}